

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

PVG_FT_Error PVG_FT_Outline_Check(PVG_FT_Outline *outline)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_2c;
  PVG_FT_Int n;
  PVG_FT_Int end;
  PVG_FT_Int end0;
  PVG_FT_Int n_contours;
  PVG_FT_Int n_points;
  PVG_FT_Outline *outline_local;
  
  if (outline != (PVG_FT_Outline *)0x0) {
    iVar1 = outline->n_points;
    iVar2 = outline->n_contours;
    if ((iVar1 == 0) && (iVar2 == 0)) {
      return 0;
    }
    if ((0 < iVar1) && (0 < iVar2)) {
      n = -1;
      for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
        iVar3 = outline->contours[local_2c];
        if (iVar3 <= n) {
          return -1;
        }
        if (iVar1 <= iVar3) {
          return -1;
        }
        n = iVar3;
      }
      if (n == iVar1 + -1) {
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

PVG_FT_Error PVG_FT_Outline_Check(PVG_FT_Outline* outline)
{
    if (outline) {
        PVG_FT_Int n_points = outline->n_points;
        PVG_FT_Int n_contours = outline->n_contours;
        PVG_FT_Int end0, end;
        PVG_FT_Int n;

        /* empty glyph? */
        if (n_points == 0 && n_contours == 0) return 0;

        /* check point and contour counts */
        if (n_points <= 0 || n_contours <= 0) goto Bad;

        end0 = end = -1;
        for (n = 0; n < n_contours; n++) {
            end = outline->contours[n];

            /* note that we don't accept empty contours */
            if (end <= end0 || end >= n_points) goto Bad;

            end0 = end;
        }

        if (end != n_points - 1) goto Bad;

        /* XXX: check the tags array */
        return 0;
    }

Bad:
    return ErrRaster_Invalid_Outline;
}